

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void NoAction<int>(void)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  undefined1 local_28 [8];
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  ResultType _result;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  poVar2 = std::operator<<(poVar2,_uncaught_exception + (*_uncaught_exception == '*'));
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"no action");
  std::operator<<(poVar2,"... ");
  std::ostream::flush();
  local_28 = (undefined1  [8])&_prof.mStart;
  _prof.mResult = (duration<double,_std::ratio<1L,_1L>_> *)std::chrono::_V2::steady_clock::now();
  iVar3 = 0;
  while (iVar3 + 1 != 0) {
    NoAction<int>::dummy = iVar3 + -0x80000000;
    iVar3 = iVar3 + 1;
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)local_28);
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar2 = std::ostream::_M_insert<double>((double)_prof.mStart.__d.__r);
  poVar2 = std::operator<<(poVar2,"s");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void NoAction()
{
    static volatile T dummy;
    PROFILING_BEGIN(T, "no action")
    dummy = i; // avoid loop optimization
    PROFILING_END()
}